

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

long remove_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  MIR_insn_t *ppMVar1;
  bb_insn_t pbVar2;
  long lVar3;
  
  if (bb->index != 2) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"  BB%lu is unreachable and removed\n");
    }
    pbVar2 = (bb->bb_insns).head;
    lVar3 = 0;
    while (pbVar2 != (bb_insn_t)0x0) {
      ppMVar1 = &pbVar2->insn;
      pbVar2 = (pbVar2->bb_insn_link).next;
      gen_delete_insn(gen_ctx,*ppMVar1);
      lVar3 = lVar3 + 1;
    }
    delete_bb(gen_ctx,bb);
    return lVar3;
  }
  __assert_fail("bb->index != 2",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1051,"long remove_bb(gen_ctx_t, bb_t)");
}

Assistant:

static long remove_bb (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, next_bb_insn;
  long deleted_insns_num = 0;

  gen_assert (bb->index != 2);
  DEBUG (2, {
    fprintf (debug_file, "  BB%lu is unreachable and removed\n", (unsigned long) bb->index);
  });
  for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
    next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
    insn = bb_insn->insn;
    gen_delete_insn (gen_ctx, insn);
    deleted_insns_num++;
  }
  delete_bb (gen_ctx, bb);
  return deleted_insns_num;
}